

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManProfileStructures(Gia_Man_t *p,int nLimit,int fVerbose)

{
  Gia_Man_t *p_00;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int nLimit_local;
  Gia_Man_t *p_local;
  
  if (p->pMuxes == (uint *)0x0) {
    p_00 = Gia_ManDupMuxes(p,2);
    Gia_ManProfileStructuresInt(p_00,nLimit,fVerbose);
    Gia_ManStop(p_00);
  }
  else {
    Gia_ManProfileStructuresInt(p,nLimit,fVerbose);
  }
  return;
}

Assistant:

void Gia_ManProfileStructures( Gia_Man_t * p, int nLimit, int fVerbose )
{
    if ( p->pMuxes )
        Gia_ManProfileStructuresInt( p, nLimit, fVerbose );
    else
    {
        Gia_Man_t * pNew = Gia_ManDupMuxes( p, 2 );
        Gia_ManProfileStructuresInt( pNew, nLimit, fVerbose );
        Gia_ManStop( pNew );
    }
}